

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

void __thiscall despot::Tag::PrintObs(Tag *this,State *state,OBS_TYPE obs,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int local_30;
  int iStack_2c;
  Coord rob;
  ostream *out_local;
  OBS_TYPE obs_local;
  State *state_local;
  Tag *this_local;
  
  iVar1 = despot::Floor::NumCells();
  if (obs == (long)iVar1) {
    poVar2 = std::operator<<(out,"On opponent");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    uVar3 = despot::Floor::GetCell((int)this + 0x58);
    poVar2 = std::operator<<(out,"Rob at (");
    local_30 = (int)uVar3;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
    poVar2 = std::operator<<(poVar2,", ");
    iStack_2c = (int)((ulong)uVar3 >> 0x20);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_2c);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Tag::PrintObs(const State& state, OBS_TYPE obs, ostream& out) const {
	if (obs == floor_.NumCells()) {
		out << "On opponent" << endl;
	} else {
		Coord rob = floor_.GetCell(obs);
		out << "Rob at (" << rob.x << ", " << rob.y << ")" << endl;
	}
}